

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtag.cpp
# Opt level: O3

string * __thiscall
Jtag::shiftData(string *__return_storage_ptr__,Jtag *this,uint bitCount,string *tdi)

{
  byte bVar1;
  long *__nptr;
  pointer pcVar2;
  int iVar3;
  char cVar4;
  sbyte sVar5;
  string *psVar6;
  Jtag *pJVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  undefined2 *puVar11;
  int *piVar12;
  long lVar13;
  BYTE *out;
  ulong uVar14;
  undefined8 uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  byte *__src;
  byte *__dest;
  uint uVar19;
  DWORD dwNumBytesSent;
  DWORD dwNumBytesRead;
  DWORD dwNumBytesToRead;
  stringstream ss;
  undefined4 local_24c;
  int local_248;
  int local_244;
  string *local_240;
  Jtag *local_238;
  byte *local_230;
  ulong local_228;
  byte *local_220;
  int local_214;
  ulong local_210;
  string *local_208;
  ulong local_200;
  string local_1f8;
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  iVar16 = ((bitCount >> 3) + 1) - (uint)((bitCount & 7) == 0);
  local_238 = this;
  puVar11 = (undefined2 *)operator_new__((ulong)(iVar16 + 3));
  local_220 = (byte *)operator_new__((ulong)(iVar16 + 3));
  local_230 = (byte *)operator_new__((ulong)(iVar16 + 6));
  local_24c = 0;
  local_244 = 0;
  local_248 = 0;
  local_208 = tdi;
  if (tdi->_M_string_length < (ulong)(((bitCount >> 2) + 1) - (uint)((bitCount & 3) == 0))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_240 = __return_storage_ptr__;
    bVar8 = flush(local_238);
    __return_storage_ptr__ = local_240;
    if (bVar8) {
      local_228 = (ulong)bitCount;
      if (bitCount < 9) {
        __nptr = (long *)(local_208->_M_dataplus)._M_p;
        piVar12 = __errno_location();
        iVar16 = *piVar12;
        *piVar12 = 0;
        lVar13 = strtol((char *)__nptr,(char **)local_1b8,0x10);
        pJVar7 = local_238;
        if (local_1b8[0] == __nptr) {
          std::__throw_invalid_argument("stoi");
LAB_00110b27:
          uVar15 = std::__throw_out_of_range("stoi");
          if (local_1b8[0] != local_1a8) {
            operator_delete(local_1b8[0],local_1a8[0] + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          _Unwind_Resume(uVar15);
        }
        if (((int)(uint)lVar13 != lVar13) || (*piVar12 == 0x22)) goto LAB_00110b27;
        if (*piVar12 == 0) {
          *piVar12 = iVar16;
        }
        *(undefined1 *)puVar11 = 0x3b;
        cVar4 = (char)local_228;
        *(char *)((long)puVar11 + 1) = cVar4 + -2;
        *(char *)(puVar11 + 1) = (char)lVar13;
        iVar16 = FT_Write(local_238->ftHandle,puVar11,3,&local_24c);
        if (iVar16 != 0) {
          operator_delete(puVar11,1);
          operator_delete(local_220,1);
          operator_delete(local_230,1);
          psVar6 = local_240;
          (local_240->_M_dataplus)._M_p = (pointer)&local_240->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
          return psVar6;
        }
        *puVar11 = 0x6e;
        *(byte *)(puVar11 + 1) = (char)((uint)lVar13 >> (cVar4 - 1U & 7)) << 7 | 3;
        iVar16 = FT_Write(pJVar7->ftHandle,puVar11,3,&local_24c);
        __dest = local_220;
        __src = local_230;
        if (iVar16 != 0) {
          operator_delete(puVar11,1);
          operator_delete(__dest,1);
          operator_delete(__src,1);
          psVar6 = local_240;
          (local_240->_M_dataplus)._M_p = (pointer)&local_240->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
          return psVar6;
        }
        do {
          iVar16 = FT_GetQueueStatus(pJVar7->ftHandle,&local_244);
        } while (iVar16 == 0 && local_244 == 0);
        iVar16 = FT_Read(pJVar7->ftHandle,__src,local_244,&local_248);
        if (iVar16 != 0) {
          operator_delete(puVar11,1);
          operator_delete(__dest,1);
          operator_delete(__src,1);
          psVar6 = local_240;
          (local_240->_M_dataplus)._M_p = (pointer)&local_240->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
          return psVar6;
        }
        *__dest = __src[1] >> (8U - (char)local_228 & 0x1f) |
                  *__src >> (9U - (char)local_228 & 0x1f);
        uVar18 = 1;
      }
      else {
        out = (BYTE *)operator_new__((ulong)(iVar16 + 1));
        pcVar2 = (local_208->_M_dataplus)._M_p;
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,pcVar2,pcVar2 + local_208->_M_string_length);
        hexToByte(&local_1f8,out);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        uVar19 = (int)local_228 - 1;
        if (0x80007 < uVar19) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Large transfers with reads may not work!",0x28);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        uVar9 = uVar19 >> 3;
        local_200 = (ulong)uVar9;
        iVar17 = 0;
        local_210 = (ulong)uVar19;
        do {
          uVar18 = 0x10000;
          if (uVar9 < 0x10000) {
            uVar18 = (ulong)uVar9;
          }
          *(undefined1 *)puVar11 = 0x39;
          iVar3 = (int)uVar18;
          *(char *)((long)puVar11 + 1) = (char)(iVar3 + -1);
          *(char *)(puVar11 + 1) = (char)((uint)(iVar3 + -1) >> 8);
          uVar14 = 0;
          do {
            *(BYTE *)((long)puVar11 + uVar14 + 3) = out[(uint)(iVar17 + (int)uVar14)];
            uVar14 = uVar14 + 1;
          } while (uVar18 != uVar14);
          iVar10 = FT_Write(local_238->ftHandle,puVar11,iVar3 + 3,&local_24c);
          pJVar7 = local_238;
          if (iVar10 != 0) {
            operator_delete(puVar11,1);
            operator_delete(local_220,1);
            operator_delete(local_230,1);
            operator_delete(out,1);
            psVar6 = local_240;
            (local_240->_M_dataplus)._M_p = (pointer)&local_240->field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
            return psVar6;
          }
          iVar17 = iVar17 + iVar3;
          uVar9 = uVar9 - iVar3;
        } while (uVar9 != 0);
        uVar19 = (uint)local_210 & 7;
        local_214 = ((uint)local_210 & 0xfffffff8) + 1;
        sVar5 = (sbyte)uVar19;
        if (local_214 == (int)local_228) {
          uVar18 = (ulong)(iVar16 - 1);
        }
        else {
          *(undefined1 *)puVar11 = 0x3b;
          *(sbyte *)((long)puVar11 + 1) = sVar5 + -1;
          uVar18 = (ulong)(iVar16 - 1);
          *(BYTE *)(puVar11 + 1) = out[uVar18];
          iVar16 = FT_Write(local_238->ftHandle,puVar11,3,&local_24c);
          psVar6 = local_240;
          if (iVar16 != 0) {
            operator_delete(puVar11,1);
            operator_delete(local_220,1);
            operator_delete(local_230,1);
            operator_delete(out,1);
            (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)psVar6,"");
            return psVar6;
          }
        }
        psVar6 = local_240;
        bVar1 = out[uVar18];
        *puVar11 = 0x6e;
        *(byte *)(puVar11 + 1) = (bVar1 >> sVar5) << 7 | 3;
        iVar16 = FT_Write(pJVar7->ftHandle,puVar11,3,&local_24c);
        __dest = local_220;
        if (iVar16 != 0) {
          operator_delete(puVar11,1);
          operator_delete(local_220,1);
          operator_delete(local_230,1);
          operator_delete(out,1);
          (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)psVar6,"");
          return psVar6;
        }
        bVar8 = local_214 == (int)local_228;
        iVar16 = (int)local_200;
        local_210 = (ulong)uVar19;
        do {
          iVar17 = FT_GetQueueStatus(local_238->ftHandle,&local_244);
          __src = local_230;
          if (local_244 == (iVar16 - (uint)bVar8) + 2) break;
        } while (iVar17 == 0);
        iVar16 = FT_Read(local_238->ftHandle,local_230,local_244,&local_248);
        if (iVar16 != 0) {
          operator_delete(puVar11,1);
          operator_delete(__dest,1);
          operator_delete(__src,1);
          operator_delete(out,1);
          (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)psVar6,"");
          return psVar6;
        }
        iVar16 = (int)local_200;
        memcpy(__dest,__src,(ulong)(iVar16 + (uint)(iVar16 == 0)));
        uVar19 = iVar16 + (uint)(iVar16 == 0);
        if (local_214 == (int)local_228) {
          __dest[uVar19] = __src[local_248 - 1] >> 7;
        }
        else {
          __dest[uVar19] =
               __src[local_248 - 1] >> (((byte)local_210 ^ 7) & 0x1f) |
               __src[uVar19] >> (8 - (byte)local_210 & 0x1f);
        }
        uVar18 = (ulong)(uVar19 + 1);
        operator_delete(out,1);
      }
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      for (; __return_storage_ptr__ = local_240, 0 < (long)uVar18; uVar18 = uVar18 - 1) {
        lVar13 = *(long *)(local_1a8[0] + -0x18);
        if (acStack_c8[lVar13 + 1] == '\0') {
          std::ios::widen((char)(ostream *)local_1a8 + (char)lVar13);
          acStack_c8[lVar13 + 1] = '\x01';
        }
        acStack_c8[lVar13] = '0';
        *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)local_1a8,(uint)__dest[uVar18 - 1]);
      }
      std::__cxx11::stringbuf::str();
      if (__return_storage_ptr__->_M_string_length - 1 == local_208->_M_string_length) {
        std::__cxx11::string::substr((ulong)local_1d8,(ulong)__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1d8);
        if (local_1d8[0] != local_1c8) {
          operator_delete(local_1d8[0],local_1c8[0] + 1);
        }
      }
      operator_delete(puVar11,1);
      operator_delete(__dest,1);
      operator_delete(__src,1);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      (local_240->_M_dataplus)._M_p = (pointer)&local_240->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Jtag::shiftData(unsigned int bitCount, string tdi) {
	FT_STATUS ftStatus;
	unsigned int reqBytes = bitCount / 8 + (bitCount % 8 > 0);
	BYTE *byOutputBuffer = new BYTE[reqBytes + 3];
	BYTE *tdoBuffer = new BYTE[reqBytes + 3];
	BYTE *byInputBuffer = new BYTE[reqBytes + 6];
	DWORD dwNumBytesSent = 0;
	DWORD dwNumBytesToRead = 0;
	DWORD dwNumBytesRead = 0;
	DWORD tdoBytes = 0;

	unsigned int reqHex = bitCount / 4 + (bitCount % 4 > 0);

	if (tdi.length() < reqHex)
		return "";

	if (!flush())
		return "";

	if (bitCount < 9) {
		int data = stoi(tdi, 0, 16);
		byOutputBuffer[0] = 0x3B;
		byOutputBuffer[1] = bitCount - 2;
		byOutputBuffer[2] = data & 0xff;
		ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			return "";
		}

		BYTE lastBit = (data >> ((bitCount - 1) % 8)) & 0x01;

		byOutputBuffer[0] = 0x6E;
		byOutputBuffer[1] = 0x00;
		byOutputBuffer[2] = 0x03 | (lastBit << 7);
		ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			return "";
		}

		do {
			ftStatus = FT_GetQueueStatus(ftHandle, &dwNumBytesToRead);
			// Get the number of bytes in the device input buffer
		} while ((dwNumBytesToRead == 0) && (ftStatus == FT_OK));
		//or Timeout
		ftStatus = FT_Read(ftHandle, byInputBuffer, dwNumBytesToRead,
				&dwNumBytesRead);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			return "";
		}

		tdoBuffer[0] = byInputBuffer[0] >> (8 - (bitCount - 1));
		tdoBuffer[0] |= byInputBuffer[1] >> (7 - (bitCount - 1));
		tdoBytes = 1;

	} else {
		BYTE *tdiBytes = new BYTE[reqBytes + 1];
		hexToByte(tdi, tdiBytes);

		unsigned int fullBytes = (bitCount - 1) / 8;
		unsigned int remBytes = fullBytes;
		unsigned int offset = 0;

		if (fullBytes > 65536) {
			cout << "Large transfers with reads may not work!" << endl;
		}

		while (remBytes > 0) {
			unsigned int bct = remBytes > 65536 ? 65536 : remBytes;
			byOutputBuffer[0] = 0x39;
			byOutputBuffer[1] = (bct - 1) & 0xff;
			byOutputBuffer[2] = ((bct - 1) >> 8) & 0xff;

			for (unsigned int i = 0; i < bct; i++) {
				byOutputBuffer[3 + i] = tdiBytes[i + offset];
			}

			ftStatus = FT_Write(ftHandle, byOutputBuffer, 3 + bct,
					&dwNumBytesSent);
			if (ftStatus != FT_OK) {
				delete byOutputBuffer;
				delete tdoBuffer;
				delete byInputBuffer;
				delete tdiBytes;
				return "";
			}

			remBytes -= bct;
			offset += bct;
		}

		unsigned int partialBits = bitCount - 1 - (fullBytes * 8);

		if (fullBytes * 8 + 1 != bitCount) {
			byOutputBuffer[0] = 0x3B;
			byOutputBuffer[1] = partialBits - 1;
			byOutputBuffer[2] = tdiBytes[reqBytes - 1] & 0xff;
			ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
			if (ftStatus != FT_OK) {
				delete byOutputBuffer;
				delete tdoBuffer;
				delete byInputBuffer;
				delete tdiBytes;
				return "";
			}
		}

		BYTE lastBit = (tdiBytes[reqBytes - 1] >> ((bitCount - 1) % 8)) & 0x01;

		byOutputBuffer[0] = 0x6E;
		byOutputBuffer[1] = 0x00;
		byOutputBuffer[2] = 0x03 | (lastBit << 7);
		ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			delete tdiBytes;
			return "";
		}

		DWORD bytesToRead = fullBytes
				+ ((fullBytes * 8 + 1 != bitCount) ? 2 : 1);
		do {
			ftStatus = FT_GetQueueStatus(ftHandle, &dwNumBytesToRead);
			// Get the number of bytes in the device input buffer
		} while ((dwNumBytesToRead != bytesToRead) && (ftStatus == FT_OK));
		//or Timeout
		ftStatus = FT_Read(ftHandle, byInputBuffer, dwNumBytesToRead,
				&dwNumBytesRead);
		if (ftStatus != FT_OK) {
			delete byOutputBuffer;
			delete tdoBuffer;
			delete byInputBuffer;
			delete tdiBytes;
			return "";
		}

		for (unsigned int i = 0; i < fullBytes; i++)
			tdoBuffer[tdoBytes++] = byInputBuffer[i];

		if (fullBytes * 8 + 1 != bitCount) {
			tdoBuffer[tdoBytes] = byInputBuffer[tdoBytes] >> (8 - partialBits);
			tdoBuffer[tdoBytes++] |= byInputBuffer[dwNumBytesRead - 1]
					>> (7 - partialBits);
		} else {
			tdoBuffer[tdoBytes++] = byInputBuffer[dwNumBytesRead - 1] >> 7;
		}

		delete tdiBytes;
	}

	//Read out the data from input buffer
	std::stringstream ss;
	for (int i = tdoBytes - 1; i >= 0; i--)
		ss << setfill('0') << setw(2) << hex << (int) tdoBuffer[i];
	string hexTdo = ss.str();
	if (hexTdo.length() - 1 == tdi.length())
		hexTdo = hexTdo.substr(1, hexTdo.length() - 1);

	delete byOutputBuffer;
	delete tdoBuffer;
	delete byInputBuffer;
	return hexTdo;
}